

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonQuoteFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  Mem *pMVar2;
  long in_FS_OFFSET;
  JsonString jx;
  JsonString local_a8;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.nAlloc = 100;
  local_a8.nUsed = 0;
  local_a8.bStatic = '\x01';
  local_a8.bErr = '\0';
  local_a8.pCtx = ctx;
  local_a8.zBuf = local_a8.zSpace;
  jsonAppendValue(&local_a8,*argv);
  if (local_a8.bErr == '\0') {
    sqlite3_result_text64
              (local_a8.pCtx,local_a8.zBuf,local_a8.nUsed,
               (_func_void_void_ptr *)(-(ulong)(local_a8.bStatic != '\0') | (ulong)sqlite3_free),
               '\x01');
    local_a8.nAlloc = 100;
    local_a8.nUsed = 0;
    local_a8.bStatic = '\x01';
    local_a8.zBuf = local_a8.zSpace;
  }
  pMVar2 = ctx->pOut;
  pMVar2->eSubtype = 'J';
  pbVar1 = (byte *)((long)&pMVar2->flags + 1);
  *pbVar1 = *pbVar1 | 8;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonQuoteFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString jx;
  UNUSED_PARAMETER(argc);

  jsonInit(&jx, ctx);
  jsonAppendValue(&jx, argv[0]);
  jsonResult(&jx);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}